

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

DropAction __thiscall
QMainWindowLayout::performPlatformWidgetDrag
          (QMainWindowLayout *this,QLayoutItem *widgetItem,QPoint *pressPosition)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  DropAction DVar1;
  QObject *pQVar2;
  QMimeData *this_00;
  QWindow *pQVar3;
  long *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  DropAction result;
  QWindow *window;
  QMimeData *mimeData;
  QWidget *widget;
  anon_class_1_0_00000001 serialize;
  QDrag drag;
  QMimeData *pQVar4;
  QWidget *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *str;
  QPoint *object;
  anon_class_1_0_00000001 *this_01;
  qsizetype in_stack_ffffffffffffff00;
  QByteArray *pQVar5;
  QDrag *this_02;
  QByteArray local_70;
  QWindow *local_58;
  char local_50 [24];
  QPoint local_38 [3];
  anon_class_1_0_00000001 local_19;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(long **)(in_RDI + 0x808) = in_RSI;
  pQVar2 = (QObject *)(**(code **)(*in_RSI + 0x68))();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QDrag *)&local_18;
  QDrag::QDrag(this_02,pQVar2);
  this_00 = (QMimeData *)operator_new(0x10);
  QMimeData::QMimeData(this_00);
  pQVar4 = this_00;
  (**(code **)(*in_RSI + 0x68))();
  DVar1 = (DropAction)((ulong)pQVar4 >> 0x20);
  pQVar3 = QWidget::windowHandle(in_stack_fffffffffffffed0);
  local_19 = (anon_class_1_0_00000001)0xaa;
  pQVar4 = this_00;
  Qt::Literals::StringLiterals::operator____L1(in_stack_fffffffffffffed8,(size_t)this_00);
  object = local_38;
  latin1.m_data = (char *)this_02;
  latin1.m_size = in_stack_ffffffffffffff00;
  QString::QString((QString *)object,latin1);
  str = local_50;
  this_01 = &local_19;
  local_58 = pQVar3;
  performPlatformWidgetDrag(QLayoutItem*,QPoint_const&)::$_0::operator()(this_01,(longlong *)object)
  ;
  QMimeData::setData((QString *)pQVar4,(QByteArray *)object);
  QByteArray::~QByteArray((QByteArray *)0x5fdf40);
  QString::~QString((QString *)0x5fdf4a);
  Qt::Literals::StringLiterals::operator____L1(str,(size_t)pQVar4);
  pQVar5 = &local_70;
  latin1_00.m_data = (char *)this_02;
  latin1_00.m_size = (qsizetype)pQVar5;
  QString::QString((QString *)object,latin1_00);
  performPlatformWidgetDrag(QLayoutItem*,QPoint_const&)::$_0::operator()(this_01,object);
  QMimeData::setData((QString *)this_00,pQVar5);
  QByteArray::~QByteArray((QByteArray *)0x5fdfcb);
  QString::~QString((QString *)0x5fdfd5);
  QDrag::setMimeData((QMimeData *)this_02);
  QFlags<Qt::DropAction>::QFlags((QFlags<Qt::DropAction> *)pQVar4,DVar1);
  DVar1 = QDrag::exec((QFlags_conflict1 *)this_02);
  *(undefined8 *)(in_RDI + 0x808) = 0;
  QDrag::~QDrag(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return DVar1;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DropAction QMainWindowLayout::performPlatformWidgetDrag(QLayoutItem *widgetItem,
                                                            const QPoint &pressPosition)
{
    draggingWidget = widgetItem;
    QWidget *widget = widgetItem->widget();
    auto drag = QDrag(widget);
    auto mimeData = new QMimeData();
    auto window = widgetItem->widget()->windowHandle();

    auto serialize = [](const auto &object) {
        QByteArray data;
        QDataStream dataStream(&data, QIODevice::WriteOnly);
        dataStream << object;
        return data;
    };
    mimeData->setData("application/x-qt-mainwindowdrag-window"_L1,
                      serialize(reinterpret_cast<qintptr>(window)));
    mimeData->setData("application/x-qt-mainwindowdrag-position"_L1, serialize(pressPosition));
    drag.setMimeData(mimeData);

    auto result = drag.exec();

    draggingWidget = nullptr;
    return result;
}